

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.H
# Opt level: O0

void __thiscall pele::physics::PMF::PmfData::initialize(PmfData *this)

{
  undefined1 uVar1;
  string *in_RDI;
  int do_average;
  string datafile;
  ParmParse pp;
  int in_stack_000008b8;
  int in_stack_000008bc;
  string *in_stack_000008c0;
  PmfData *in_stack_000008c8;
  undefined7 in_stack_ffffffffffffff20;
  ParmParse *this_00;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [20];
  int in_stack_ffffffffffffff8c;
  string *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ParmParse *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  
  this_00 = (ParmParse *)&local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"pmf",(allocator *)this_00);
  amrex::ParmParse::ParmParse(this_00,in_RDI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::string(local_c0);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c);
  uVar1 = amrex::ParmParse::contains
                    ((ParmParse *)datafile.field_2._M_allocated_capacity,
                     (char *)datafile._M_string_length);
  if (!(bool)uVar1) {
    amrex::Abort_host((char *)this_00);
  }
  amrex::ParmParse::get
            (in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  read_pmf(in_stack_000008c8,in_stack_000008c0,in_stack_000008bc,in_stack_000008b8);
  allocate((PmfData *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  std::__cxx11::string::~string(local_c0);
  amrex::ParmParse::~ParmParse((ParmParse *)0x1229bb);
  return;
}

Assistant:

void initialize()
  {
    amrex::ParmParse pp("pmf");
    std::string datafile;
    pp.query("v", m_verbose);
    int do_average = 1;
    pp.query("do_cellAverage", do_average);
    if (!pp.contains("datafile")) {
      amrex::Abort("pmf.datafile is required when using pmf");
    }
    pp.get("datafile", datafile);
    read_pmf(datafile, do_average, m_verbose);
    allocate();
  }